

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Module.cpp
# Opt level: O1

void __thiscall soul::Module::Module(Module *this,Program *p,ModuleType type)

{
  (this->program).pimpl = p->pimpl;
  (this->program).refHolder.object = (ProgramImpl *)0x0;
  (this->shortName)._M_dataplus._M_p = (pointer)&(this->shortName).field_2;
  (this->shortName)._M_string_length = 0;
  (this->shortName).field_2._M_local_buf[0] = '\0';
  (this->fullName)._M_dataplus._M_p = (pointer)&(this->fullName).field_2;
  (this->fullName)._M_string_length = 0;
  (this->fullName).field_2._M_local_buf[0] = '\0';
  (this->originalFullName)._M_dataplus._M_p = (pointer)&(this->originalFullName).field_2;
  (this->originalFullName)._M_string_length = 0;
  (this->originalFullName).field_2._M_local_buf[0] = '\0';
  (this->inputs).
  super__Vector_base<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inputs).
  super__Vector_base<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->inputs).
  super__Vector_base<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->outputs).
  super__Vector_base<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->outputs).
  super__Vector_base<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->outputs).
  super__Vector_base<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->connections).
  super__Vector_base<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->connections).
  super__Vector_base<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->connections).
  super__Vector_base<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->processorInstances).
  super__Vector_base<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->processorInstances).
  super__Vector_base<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->processorInstances).
  super__Vector_base<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->annotation).properties._M_t.
  super___uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
  .
  super__Head_base<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_false>
  ._M_head_impl =
       (vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_> *)0x0;
  (this->annotation).dictionary.super_StringDictionary._vptr_StringDictionary =
       (_func_int **)&PTR__StringDictionary_002d3a30;
  (this->annotation).dictionary.strings.
  super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->annotation).dictionary.strings.
  super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->annotation).dictionary.strings.
  super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->annotation).dictionary.nextIndex = 1;
  this->sampleRate = 0.0;
  this->latency = 0;
  (this->location).sourceCode.object = (SourceCodeText *)0x0;
  (this->location).location.data = (char *)0x0;
  this->moduleUseTestFlag = false;
  this->allocator = &p->pimpl->allocator;
  (this->functions).functions.items =
       (pool_ref<soul::heart::Function> *)(this->functions).functions.space;
  (this->functions).functions.numActive = 0;
  (this->functions).functions.numAllocated = 0x20;
  (this->functions).module = this;
  (this->stateVariables).stateVariables.items =
       (pool_ref<soul::heart::Variable> *)(this->stateVariables).stateVariables.space;
  (this->stateVariables).stateVariables.numActive = 0;
  (this->stateVariables).stateVariables.numAllocated = 0x20;
  (this->structs).structs.items = (RefCountedPtr<soul::Structure> *)(this->structs).structs.space;
  (this->structs).structs.numActive = 0;
  (this->structs).structs.numAllocated = 0x20;
  this->moduleID = 0;
  this->moduleType = type;
  return;
}

Assistant:

Module::Module (Program& p, ModuleType type)
   : program (*p.pimpl, false), allocator (p.getAllocator()), functions (*this), moduleType (type)
{
}